

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O1

int IFN_Next_Character(FORM *form)

{
  FIELD *field;
  _Bool _Var1;
  int iVar2;
  int iVar3;
  
  field = form->current;
  iVar2 = form->curcol + 1;
  form->curcol = iVar2;
  if (iVar2 == field->dcols) {
    iVar3 = form->currow + 1;
    form->currow = iVar3;
    iVar2 = 0;
    if (iVar3 == field->drows) {
      if ((int)field->rows + field->nrow != 1) {
        _Var1 = Field_Grown(field,1);
        iVar3 = 0;
        iVar2 = 0;
        if (_Var1) goto LAB_0045af86;
      }
      form->currow = form->currow + -1;
      if ((int)field->rows + field->nrow == 1) {
        _Var1 = Field_Grown(field,1);
        if (_Var1) goto LAB_0045af74;
      }
      iVar2 = form->curcol + -1;
      iVar3 = -0xc;
    }
    else {
      iVar3 = 0;
    }
LAB_0045af86:
    form->curcol = iVar2;
  }
  else {
LAB_0045af74:
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int IFN_Next_Character(FORM * form)
{
  FIELD *field = form->current;
  
  if ((++(form->curcol))==field->dcols)
    {
      if ((++(form->currow))==field->drows)
        {
#if GROW_IF_NAVIGATE
          if (!Single_Line_Field(field) && Field_Grown(field,1)) {
            form->curcol = 0;
            return(E_OK);
          }
#endif
          form->currow--;
#if GROW_IF_NAVIGATE
          if (Single_Line_Field(field) && Field_Grown(field,1))
            return(E_OK);
#endif
          form->curcol--;
          return(E_REQUEST_DENIED);
        }
      form->curcol = 0;
    }
  return(E_OK);
}